

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O2

QString * Html::spanZebra(QString *__return_storage_ptr__,QStringList *text,QString *color,
                         QString *background,QString *altBackground)

{
  QString *background_00;
  long lVar1;
  int i;
  ulong uVar2;
  QStringList result;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  lVar1 = 0;
  for (uVar2 = 0; (long)uVar2 < (text->d).size; uVar2 = uVar2 + 1) {
    background_00 = altBackground;
    if ((uVar2 & 1) == 0) {
      background_00 = background;
    }
    span((QString *)&local_60,(QString *)((long)&(((text->d).ptr)->d).d + lVar1),color,background_00
        );
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    lVar1 = lVar1 + 0x18;
  }
  QString::QString((QString *)&local_60,"");
  QListSpecialMethods<QString>::join
            (__return_storage_ptr__,(QListSpecialMethods<QString> *)&local_48,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  return __return_storage_ptr__;
}

Assistant:

QString Html::spanZebra(const QStringList& text, const QString& color, const QString& background, const QString& altBackground)
{
    QStringList result;
    for(int i=0;i<text.size();i++) {
        result << span(text[i],color,i % 2 ? altBackground : background);
    }
    return result.join("");
}